

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O2

size_t __thiscall
adios2::plugin::PluginOperator::InverseOperate
          (PluginOperator *this,char *bufferIn,size_t sizeIn,char *dataOut)

{
  Impl *pIVar1;
  PluginOperatorInterface *pPVar2;
  iterator iVar3;
  size_t sVar4;
  allocator local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string pluginName;
  string local_70;
  size_t offset;
  string local_48;
  
  offset = 4;
  core::Operator::GetParameters<unsigned_long>
            ((Params *)&pluginName,&this->super_Operator,bufferIn,&offset);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(this->m_Impl)._M_t.
                 super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                 .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&pluginName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&pluginName);
  pIVar1 = (this->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&pluginName,"PluginName",(allocator *)&local_e0);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pIVar1,&pluginName);
  std::__cxx11::string::~string((string *)&pluginName);
  if (iVar3._M_node ==
      (_Base_ptr)
      ((long)&(((this->m_Impl)._M_t.
                super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl)
              ->m_PluginParams)._M_t + 8U)) {
    std::__cxx11::string::string((string *)&pluginName,"Plugins",(allocator *)&local_48);
    std::__cxx11::string::string((string *)&local_e0,"PluginOperator",&local_e2);
    std::__cxx11::string::string((string *)&local_c0,"InverseOperate",&local_e3);
    std::__cxx11::string::string
              ((string *)&local_70,"PluginName could not be found in the plugin header",&local_e4);
    helper::Throw<std::runtime_error>(&pluginName,&local_e0,&local_c0,&local_70,-1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&pluginName);
  }
  std::__cxx11::string::string((string *)&pluginName,(string *)(iVar3._M_node + 2));
  pIVar1 = (this->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_e0,"PluginLibrary",(allocator *)&local_c0);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pIVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (iVar3._M_node ==
      (_Base_ptr)
      ((long)&(((this->m_Impl)._M_t.
                super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl)
              ->m_PluginParams)._M_t + 8U)) {
    std::__cxx11::string::string((string *)&local_e0,"Plugins",&local_e2);
    std::__cxx11::string::string((string *)&local_c0,"PluginOperator",&local_e3);
    std::__cxx11::string::string((string *)&local_70,"InverseOperate",&local_e4);
    std::__cxx11::string::string
              ((string *)&local_48,"PluginLibrary could not be found in the plugin header",&local_e1
              );
    helper::Throw<std::runtime_error>(&local_e0,&local_c0,&local_70,&local_48,-1);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  PluginInit(this,&pluginName,(string *)(iVar3._M_node + 2));
  pPVar2 = ((this->m_Impl)._M_t.
            super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
            .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl)->
           m_Plugin;
  sVar4 = (**(code **)((long)(pPVar2->super_Operator)._vptr_Operator + 0xa8))
                    (pPVar2,bufferIn + offset,sizeIn - offset,dataOut);
  std::__cxx11::string::~string((string *)&pluginName);
  return sVar4;
}

Assistant:

size_t PluginOperator::InverseOperate(const char *bufferIn, const size_t sizeIn, char *dataOut)
{
    size_t offset = 4; // skip 4 bytes for the common header

    // now handle plugin specific header
    m_Impl->m_PluginParams = GetParameters(bufferIn, offset);

    auto paramPluginNameIt = m_Impl->m_PluginParams.find("PluginName");
    if (paramPluginNameIt == m_Impl->m_PluginParams.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginOperator", "InverseOperate",
                                          "PluginName could not be found in the plugin header");
    }
    std::string pluginName = paramPluginNameIt->second;

    auto paramPluginLibraryIt = m_Impl->m_PluginParams.find("PluginLibrary");
    if (paramPluginLibraryIt == m_Impl->m_PluginParams.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginOperator", "InverseOperate",
                                          "PluginLibrary could not be found in the plugin header");
    }
    const std::string &pluginLibrary = paramPluginLibraryIt->second;

    // now set up the plugin if it hasn't already
    PluginInit(pluginName, pluginLibrary);

    // add offset to bufferIn, so plugin doesn't have to worry about plugin
    // header or common header
    size_t pluginSize =
        m_Impl->m_Plugin->InverseOperate(bufferIn + offset, sizeIn - offset, dataOut);
    return pluginSize;
}